

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[10],int,char[24],std::__cxx11::string,char[37],char_const*,char[69]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [10],int *Args_1,
          char (*Args_2) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [37],char **Args_5,char (*Args_6) [69])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [37];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local_3;
  char (*Args_local_2) [24];
  int *Args_local_1;
  char (*Args_local) [10];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[10],int,char[24],std::__cxx11::string,char[37],char_const*,char[69]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [10])this,(int *)Args,(char (*) [24])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [37])Args_3,(char **)Args_4,(char (*) [69])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}